

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.hpp
# Opt level: O1

void __thiscall
deqp::gls::VarSpec::set<4,4>
          (VarSpec *this,Matrix<float,_4,_4> *minValue_,Matrix<float,_4,_4> *maxValue_)

{
  DataType DVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int col;
  long lVar4;
  long lVar5;
  Array<float,_16> data;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  puVar2 = &local_58;
  puVar3 = &local_58;
  DVar1 = glu::getDataTypeMatrix(4,4);
  this->type = DVar1;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)puVar2 + lVar5) =
           *(undefined4 *)
            ((long)((Vector<tcu::Vector<float,_4>,_4> *)((Vector<float,_4> *)minValue_)->m_data)->
                   m_data[0].m_data + lVar5);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x10);
    lVar4 = lVar4 + 1;
    minValue_ = (Matrix<float,_4,_4> *)((long)minValue_ + 0x10);
    puVar2 = (undefined8 *)((long)puVar2 + 0x10);
  } while (lVar4 != 4);
  *(undefined8 *)((long)&this->minValue + 0x30) = local_28;
  *(undefined8 *)((long)&this->minValue + 0x38) = uStack_20;
  *(undefined8 *)((long)&this->minValue + 0x20) = local_38;
  *(undefined8 *)((long)&this->minValue + 0x28) = uStack_30;
  *(undefined8 *)((long)&this->minValue + 0x10) = local_48;
  *(undefined8 *)((long)&this->minValue + 0x18) = uStack_40;
  *(undefined8 *)&this->minValue = local_58;
  *(undefined8 *)((long)&this->minValue + 8) = uStack_50;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)puVar3 + lVar5) =
           *(undefined4 *)
            ((long)((Vector<tcu::Vector<float,_4>,_4> *)((Vector<float,_4> *)maxValue_)->m_data)->
                   m_data[0].m_data + lVar5);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x10);
    lVar4 = lVar4 + 1;
    maxValue_ = (Matrix<float,_4,_4> *)((long)maxValue_ + 0x10);
    puVar3 = (undefined8 *)((long)puVar3 + 0x10);
  } while (lVar4 != 4);
  *(undefined8 *)((long)&this->maxValue + 0x30) = local_28;
  *(undefined8 *)((long)&this->maxValue + 0x38) = uStack_20;
  *(undefined8 *)((long)&this->maxValue + 0x20) = local_38;
  *(undefined8 *)((long)&this->maxValue + 0x28) = uStack_30;
  *(undefined8 *)((long)&this->maxValue + 0x10) = local_48;
  *(undefined8 *)((long)&this->maxValue + 0x18) = uStack_40;
  *(undefined8 *)&this->maxValue = local_58;
  *(undefined8 *)((long)&this->maxValue + 8) = uStack_50;
  return;
}

Assistant:

void set (const tcu::Matrix<float, ValRows, ValCols>& minValue_, const tcu::Matrix<float, ValRows, ValCols>& maxValue_)
	{
		type = glu::getDataTypeMatrix(ValCols, ValRows);
		matToArr(minValue_, minValue.f);
		matToArr(maxValue_, maxValue.f);
	}